

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::applyTransformationTransposed<1,(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,double *weights,MultiIndexSet *work,
          vector<int,_std::allocator<int>_> *active_points)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  pointer piVar4;
  void *pvVar5;
  _Bit_type *p_Var6;
  int iVar7;
  pointer piVar8;
  long lVar9;
  Data2D<int> *pDVar10;
  long lVar11;
  _Bit_type *p_Var12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  vector<int,_std::allocator<int>_> *pvVar18;
  uint uVar19;
  GridLocalPolynomial *pGVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  double dVar27;
  vector<bool,_std::allocator<bool>_> used;
  vector<double,_std::allocator<double>_> node;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> level;
  Data2D<int> lparents;
  allocator_type local_151;
  ulong local_150;
  GridLocalPolynomial *local_148;
  int local_140;
  int local_13c;
  MultiIndexSet *local_138;
  ulong local_130;
  vector<bool,_std::allocator<bool>_> local_128;
  ulong local_100;
  vector<double,_std::allocator<double>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  Data2D<int> local_98;
  double *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> *local_48;
  Data2D<int> *local_40;
  double local_38;
  
  local_148 = this;
  local_138 = work;
  local_70 = weights;
  if (work->cache_num_indexes == (int)(this->parents).num_strips) {
    local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_98.stride = 0;
    local_98.num_strips = 0;
    local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)2>(&local_98,work);
  }
  local_13c = (int)(local_148->parents).num_strips;
  local_140 = local_138->cache_num_indexes;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_b0,
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_128);
  pGVar20 = local_148;
  piVar8 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar8;
  if (lVar9 == 0) {
    local_150 = 0;
  }
  else {
    lVar9 = lVar9 >> 2;
    sVar3 = local_138->num_dimensions;
    piVar4 = (local_138->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_150 = 0;
    lVar17 = 0;
    do {
      lVar24 = (long)piVar8[lVar17] * sVar3;
      uVar13 = piVar4[lVar24];
      uVar19 = uVar13;
      if ((1 < uVar13) && (uVar19 = 1, uVar13 != 2)) {
        uVar13 = uVar13 - 1;
        do {
          uVar13 = (int)uVar13 >> 1;
          uVar19 = uVar19 + 1;
        } while (1 < uVar13);
      }
      lVar22 = (long)(local_148->super_BaseCanonicalGrid).num_dimensions;
      if (1 < lVar22) {
        lVar11 = 1;
        do {
          uVar13 = piVar4[lVar24 + lVar11];
          uVar25 = uVar13;
          if ((1 < uVar13) && (uVar25 = 1, uVar13 != 2)) {
            uVar13 = uVar13 - 1;
            do {
              uVar13 = (int)uVar13 >> 1;
              uVar25 = uVar25 + 1;
            } while (1 < uVar13);
          }
          uVar19 = uVar19 + uVar25;
          lVar11 = lVar11 + 1;
        } while (lVar11 != lVar22);
      }
      if ((int)local_150 <= (int)uVar19) {
        local_150 = (ulong)uVar19;
      }
      local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar17] = uVar19;
      lVar17 = lVar17 + 1;
    } while (lVar17 != lVar9 + (ulong)(lVar9 == 0));
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_e0,(long)local_148->top_level + 1,(allocator_type *)&local_128);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_c8,(long)pGVar20->top_level + 1,(allocator_type *)&local_128);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&local_128,(long)local_138->cache_num_indexes,(bool *)&local_f8,&local_151);
  iVar21 = (local_148->super_BaseCanonicalGrid).num_dimensions;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_f8,(long)iVar21,(allocator_type *)&local_151);
  if (0 < (int)local_150) {
    local_100 = (ulong)(uint)(iVar21 * 2);
    local_40 = &local_148->parents;
    local_48 = &(local_148->parents).vec;
    local_50 = 0x800000000000003f;
    local_68 = active_points;
    pGVar20 = local_148;
    do {
      piVar8 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar8) {
        uVar15 = 0;
        do {
          local_130 = uVar15;
          if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar15] == (int)local_150) {
            if (0 < (pGVar20->super_BaseCanonicalGrid).num_dimensions) {
              iVar21 = piVar8[uVar15];
              sVar3 = local_138->num_dimensions;
              piVar4 = (local_138->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar9 = 0;
              do {
                dVar27 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>
                                   (piVar4[(long)iVar21 * sVar3 + lVar9]);
                *(double *)
                 (CONCAT71(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._0_1_) + lVar9 * 8) = dVar27;
                lVar9 = lVar9 + 1;
                pGVar20 = local_148;
              } while (lVar9 < (local_148->super_BaseCanonicalGrid).num_dimensions);
            }
            uVar13 = local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
            p_Var6 = local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
            p_Var12 = local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            if (local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) {
              memset(local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                     (long)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              p_Var12 = p_Var6;
              pGVar20 = local_148;
            }
            if (uVar13 != 0) {
              *p_Var12 = *p_Var12 & ~(0xffffffffffffffffU >> (-(char)uVar13 & 0x3fU));
            }
            *local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = 0;
            *local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[local_130];
            if (*local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start < (int)local_100) {
              iVar7 = 0;
              uVar15 = local_100;
              iVar21 = local_13c;
              iVar23 = local_140;
              do {
                iVar1 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar7];
                if (iVar1 < (int)uVar15) {
                  pDVar10 = &local_98;
                  if (iVar23 == iVar21) {
                    pDVar10 = local_40;
                  }
                  pvVar18 = &local_98.vec;
                  if (iVar23 == iVar21) {
                    pvVar18 = local_48;
                  }
                  iVar2 = (pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start
                          [(long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar7] * pDVar10->stride +
                           (long)iVar1];
                  uVar14 = (ulong)iVar2;
                  if (uVar14 != 0xffffffffffffffff) {
                    uVar26 = uVar14 + 0x3f;
                    if (-1 < (long)uVar14) {
                      uVar26 = uVar14;
                    }
                    uVar16 = (ulong)((uVar14 & local_50) < 0x8000000000000001);
                    if ((local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar26 >> 6) + (uVar16 - 1)] >> (uVar14 & 0x3f) & 1) == 0) {
                      lVar9 = local_138->num_dimensions * uVar14;
                      piVar4 = (local_138->indexes).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      local_60 = 1L << ((byte)iVar2 & 0x3f);
                      local_58 = uVar16;
                      dVar27 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                                         (pGVar20->order,piVar4[lVar9],
                                          *(double *)
                                           CONCAT71(local_f8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_f8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_));
                      uVar13 = (pGVar20->super_BaseCanonicalGrid).num_dimensions;
                      if (1 < (int)uVar13) {
                        lVar17 = 1;
                        do {
                          local_38 = dVar27;
                          dVar27 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                                             (pGVar20->order,piVar4[lVar9 + lVar17],
                                              *(double *)
                                               (CONCAT71(local_f8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_f8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                               lVar17 * 8));
                          dVar27 = local_38 * dVar27;
                          lVar17 = lVar17 + 1;
                          uVar13 = (pGVar20->super_BaseCanonicalGrid).num_dimensions;
                        } while (lVar17 < (int)uVar13);
                      }
                      if (0 < (int)uVar13) {
                        iVar21 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start[local_130];
                        uVar15 = 0;
                        do {
                          local_70[(long)(int)(uVar13 * iVar2) + uVar15] =
                               local_70[(long)(int)(uVar13 * iVar2) + uVar15] -
                               local_70[(long)(int)uVar13 * (long)iVar21 + uVar15] * dVar27;
                          uVar15 = uVar15 + 1;
                        } while (uVar13 != uVar15);
                      }
                      local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [((long)uVar26 >> 6) + (local_58 - 1)] =
                           local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [((long)uVar26 >> 6) + (local_58 - 1)] | local_60;
                      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar7 + 1] = 0;
                      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar7 + 1] = iVar2;
                      active_points = local_68;
                      uVar15 = local_100;
                      iVar21 = local_13c;
                      iVar23 = local_140;
                      iVar7 = iVar7 + 1;
                      goto LAB_0019c0e6;
                    }
                  }
                  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7] = iVar1 + 1;
                }
                else {
                  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar7 + -1] =
                       local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)iVar7 + -1] + 1;
                  iVar7 = iVar7 + -1;
                }
LAB_0019c0e6:
              } while (*local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start < (int)uVar15);
            }
          }
          uVar15 = local_130 + 1;
          piVar8 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar15 < (ulong)((long)(active_points->
                                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar8 >> 2));
      }
      iVar21 = (int)local_150;
      local_150 = (ulong)(iVar21 - 1);
    } while (1 < iVar21);
  }
  pvVar5 = (void *)CONCAT71(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_f8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  if (local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridLocalPolynomial::applyTransformationTransposed(double weights[], const MultiIndexSet &work, const std::vector<int> &active_points) const {
    Data2D<int> lparents = (parents.getNumStrips() != work.getNumIndexes()) ? // if the current dag loaded in parents does not reflect the indexes in work
                            HierarchyManipulations::computeDAGup<effrule>(work) :
                            Data2D<int>();

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    std::vector<int> level(active_points.size());
    int active_top_level = 0;
    for(size_t i=0; i<active_points.size(); i++){
        const int *p = work.getIndex(active_points[i]);
        int current_level = RuleLocal::getLevel<effrule>(p[0]);
        for(int j=1; j<num_dimensions; j++){
            current_level += RuleLocal::getLevel<effrule>(p[j]);
        }
        if (active_top_level < current_level) active_top_level = current_level;
        level[i] = current_level;
    }

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);
    std::vector<bool> used(work.getNumIndexes());
    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);

    for(int l=active_top_level; l>0; l--){
        for(size_t i=0; i<active_points.size(); i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(active_points[i]);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = active_points[i];
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            double basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);

                            if (mode == 0) {
                                weights[branch] -= weights[active_points[i]] * basis_value;
                            } else {
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -=
                                            weights[active_points[i] * num_dimensions + d] * basis_value;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}